

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O3

void __thiscall Editor::saveAsBoard(Editor *this,path *filename,bool overwriteFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  source_loc loc;
  bool bVar3;
  path *ppVar4;
  logger *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view_t fmt;
  string ret;
  path saveFilename;
  settings tmp;
  allocator_type local_161;
  string local_160;
  string_type local_140;
  file_dialog local_120;
  path local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [24];
  string local_50;
  
  ghc::filesystem::path::path(&local_110);
  bVar3 = ghc::filesystem::path::empty(filename);
  if (bVar3) {
    pfd::settings::settings((settings *)&local_d8,false);
    if ((((pfd::settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
         (pfd::settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
        (pfd::settings::flags(pfd::settings::flag)::flags._4_1_ != '\x01')) &&
       (pfd::settings::flags(pfd::settings::flag)::flags._5_1_ != '\x01')) {
      plVar5 = spdlog::default_logger_raw();
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      spdlog::logger::log(plVar5,0.0);
      ppVar4 = Board::getFilename(this->board_);
      EditorInterface::showFileDialog(&this->interface_,false,ppVar4);
      goto LAB_00146a6b;
    }
    Board::getDefaultFileExtension((path *)&local_140,this->board_);
    paVar1 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".txt","");
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_160,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    ghc::filesystem::path::postprocess_path_with_format((path *)&local_160,auto_format);
    bVar3 = ghc::filesystem::operator==((path *)&local_140,(path *)&local_160);
    ghc::filesystem::path::~path((path *)&local_160);
    ghc::filesystem::path::~path((path *)&local_140);
    if (bVar3) {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Save As","");
      ppVar4 = Board::getFilename(this->board_);
      ghc::filesystem::path::string_abi_cxx11_(&local_50,ppVar4);
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Plain Text (*.txt)","");
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"*.txt","");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"All Files (*.*)","");
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"*","");
      __l._M_len = 4;
      __l._M_array = &local_d8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_f0,__l,&local_161);
      pfd::internal::file_dialog::file_dialog(&local_120,save,&local_160,&local_50,&local_f0,none);
      do {
        bVar3 = pfd::internal::executor::ready
                          (local_120.super_dialog.m_async.
                           super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,0x14);
      } while (!bVar3);
      pcVar2 = ((local_120.super_dialog.m_async.
                 super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_stdout)._M_dataplus._M_p;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar2,
                 pcVar2 + ((local_120.super_dialog.m_async.
                            super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_stdout)._M_string_length);
      while ((local_140._M_string_length != 0 &&
             ((local_140._M_dataplus._M_p[local_140._M_string_length - 1] == '/' ||
              (local_140._M_dataplus._M_p[local_140._M_string_length - 1] == '\n'))))) {
        std::__cxx11::string::pop_back();
      }
      ghc::filesystem::path::operator=(&local_110,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if (local_120.super_dialog.m_async.
          super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.super_dialog.m_async.
                   super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      lVar6 = 0;
      do {
        if (local_68 + lVar6 != *(undefined1 **)((long)local_78 + lVar6)) {
          operator_delete(*(undefined1 **)((long)local_78 + lVar6));
        }
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      overwriteFile = true;
    }
    else {
      Board::getDefaultFileExtension((path *)&local_140,this->board_);
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_160,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      ghc::filesystem::path::postprocess_path_with_format((path *)&local_160,auto_format);
      bVar3 = ghc::filesystem::operator==((path *)&local_140,(path *)&local_160);
      ghc::filesystem::path::~path((path *)&local_160);
      ghc::filesystem::path::~path((path *)&local_140);
      overwriteFile = true;
      if (bVar3) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Save As","");
        ppVar4 = Board::getFilename(this->board_);
        ghc::filesystem::path::string_abi_cxx11_(&local_50,ppVar4);
        local_d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"All Files (*.*)","");
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"*","");
        __l_00._M_len = 2;
        __l_00._M_array = &local_d8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_f0,__l_00,&local_161);
        pfd::internal::file_dialog::file_dialog(&local_120,save,&local_160,&local_50,&local_f0,none)
        ;
        do {
          bVar3 = pfd::internal::executor::ready
                            (local_120.super_dialog.m_async.
                             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,0x14);
        } while (!bVar3);
        pcVar2 = ((local_120.super_dialog.m_async.
                   super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_stdout)._M_dataplus._M_p;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,pcVar2,
                   pcVar2 + ((local_120.super_dialog.m_async.
                              super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_stdout)._M_string_length);
        while ((local_140._M_string_length != 0 &&
               ((local_140._M_dataplus._M_p[local_140._M_string_length - 1] == '/' ||
                (local_140._M_dataplus._M_p[local_140._M_string_length - 1] == '\n'))))) {
          std::__cxx11::string::pop_back();
        }
        ghc::filesystem::path::operator=(&local_110,&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if (local_120.super_dialog.m_async.
            super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.super_dialog.m_async.
                     super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f0);
        lVar6 = 0;
        do {
          if (local_a8 + lVar6 != *(undefined1 **)((long)local_b8 + lVar6)) {
            operator_delete(*(undefined1 **)((long)local_b8 + lVar6));
          }
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    ghc::filesystem::path::operator=(&local_110,filename);
  }
  bVar3 = ghc::filesystem::path::empty(&local_110);
  if (bVar3) {
    plVar5 = spdlog::default_logger_raw();
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    spdlog::logger::log(plVar5,0.0);
  }
  else if ((overwriteFile == false) && (bVar3 = ghc::filesystem::exists(&local_110), bVar3)) {
    EditorInterface::showOverwriteDialog(&this->interface_,&local_110);
  }
  else {
    plVar5 = spdlog::default_logger_raw();
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x11;
    fmt.data_ = "Saving to \"{}\"...";
    spdlog::logger::log_<ghc::filesystem::path&>(plVar5,loc,info,fmt,&local_110);
    Board::saveAsFile(this->board_,&local_110);
    this->savedEditSize_ = this->lastEditSize_;
  }
LAB_00146a6b:
  ghc::filesystem::path::~path(&local_110);
  return;
}

Assistant:

void Editor::saveAsBoard(const fs::path& filename, bool overwriteFile) {
    fs::path saveFilename;
    if (!filename.empty()) {
        saveFilename = filename;
    } else if (pfd::settings::available()) {
        if (board_.getDefaultFileExtension() == ".txt") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "Plain Text (*.txt)", "*.txt",
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else if (board_.getDefaultFileExtension() == "") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else {
            assert(false);
        }

        // The pfd call will prompt the user if overwriting, so skip our check for existing file.
        overwriteFile = true;
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(false, board_.getFilename());
    }

    if (!saveFilename.empty()) {
        if (!overwriteFile && fs::exists(saveFilename)) {
            return interface_.showOverwriteDialog(saveFilename);
        }

        spdlog::info("Saving to \"{}\"...", saveFilename);
        board_.saveAsFile(saveFilename);
        savedEditSize_ = lastEditSize_;
    } else {
        spdlog::info("No file selected.");
    }
}